

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O3

void __thiscall
EnrichableSpiAnalyzer::AdvanceToActiveEnableEdgeWithCorrectClockPolarity
          (EnrichableSpiAnalyzer *this)

{
  bool bVar1;
  
  AnalyzerResults::CommitPacketAndStartNewPacket();
  AnalyzerResults::CommitResults();
  AdvanceToActiveEnableEdge(this);
  do {
    bVar1 = IsInitialClockPolarityCorrect(this);
  } while (!bVar1);
  return;
}

Assistant:

void EnrichableSpiAnalyzer::AdvanceToActiveEnableEdgeWithCorrectClockPolarity()
{
	mResults->CommitPacketAndStartNewPacket();
	mResults->CommitResults();
	
	AdvanceToActiveEnableEdge();

	for( ; ; )
	{
		if( IsInitialClockPolarityCorrect() == true )  //if false, this function moves to the next active enable edge.
			break;
	}
}